

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theme.cpp
# Opt level: O0

float __thiscall gui::Theme::computeTextMaxHeightRatio(Theme *this,Font *font)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  FloatRect FVar4;
  FloatRect bounds;
  Text text;
  char c;
  string characterSample;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  uint in_stack_fffffffffffffdfc;
  Font *font_00;
  allocator *string;
  Text *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  String *in_stack_fffffffffffffe20;
  Text local_1b8;
  char local_45;
  allocator local_31;
  string local_30 [48];
  
  string = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",string);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  for (local_45 = ' '; local_45 < '\x7f'; local_45 = local_45 + '\x01') {
    std::__cxx11::string::push_back((char)local_30);
  }
  font_00 = (Font *)&stack0xfffffffffffffe20;
  std::locale::locale((locale *)font_00);
  sf::String::String(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                     (locale *)in_stack_fffffffffffffe10);
  sf::Text::Text(in_stack_fffffffffffffe10,(String *)string,font_00,in_stack_fffffffffffffdfc);
  sf::String::~String((String *)0x1dc203);
  std::locale::~locale((locale *)&stack0xfffffffffffffe20);
  FVar4 = sf::Text::getLocalBounds
                    ((Text *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  fVar2 = FVar4.top + FVar4.height;
  uVar1 = sf::Text::getCharacterSize(&local_1b8);
  fVar3 = fVar2 / (float)uVar1;
  sf::Text::~Text((Text *)CONCAT44(uVar1,fVar2));
  std::__cxx11::string::~string(local_30);
  return fVar3;
}

Assistant:

float Theme::computeTextMaxHeightRatio(const sf::Font& font) const {
    std::string characterSample = "";
    for (char c = '\u0020'; c < '\u007f'; ++c) {
        characterSample.push_back(c);
    }
    GUI_DEBUG << "characterSample = [" << characterSample << "]\n";

    sf::Text text(characterSample, font);
    const auto bounds = text.getLocalBounds();
    return (bounds.top + bounds.height) / text.getCharacterSize();
}